

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_cpsr_write_eret_arm(CPUARMState *env,uint32_t val)

{
  uint64_t features;
  uint32_t mask_00;
  ArchCPU_conflict *pAVar1;
  uint uVar2;
  uint32_t mask;
  uint32_t val_local;
  CPUARMState *env_local;
  
  pAVar1 = env_archcpu(env);
  arm_call_pre_el_change_hook(pAVar1);
  features = env->features;
  pAVar1 = env_archcpu(env);
  mask_00 = aarch32_cpsr_valid_mask(features,&pAVar1->isar);
  cpsr_write_arm(env,val,mask_00,CPSRWriteExceptionReturn);
  uVar2 = 0xfffffffc;
  if (env->thumb != 0) {
    uVar2 = 0xfffffffe;
  }
  env->regs[0xf] = uVar2 & env->regs[0xf];
  arm_rebuild_hflags_arm(env);
  pAVar1 = env_archcpu(env);
  arm_call_el_change_hook(pAVar1);
  return;
}

Assistant:

void HELPER(cpsr_write_eret)(CPUARMState *env, uint32_t val)
{
    uint32_t mask;

    arm_call_pre_el_change_hook(env_archcpu(env));

    mask = aarch32_cpsr_valid_mask(env->features, &env_archcpu(env)->isar);
    cpsr_write(env, val, mask, CPSRWriteExceptionReturn);

    /* Generated code has already stored the new PC value, but
     * without masking out its low bits, because which bits need
     * masking depends on whether we're returning to Thumb or ARM
     * state. Do the masking now.
     */
    env->regs[15] &= (env->thumb ? ~1 : ~3);
    arm_rebuild_hflags(env);

    arm_call_el_change_hook(env_archcpu(env));
}